

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void gola_fixup(LexState *ls,FuncScope *bl)

{
  uint uVar1;
  VarInfo *pVVar2;
  uint64_t uVar3;
  VarInfo *pVVar4;
  VarInfo *pVVar5;
  byte bVar6;
  VarInfo *local_38;
  VarInfo *vg;
  GCstr *name;
  VarInfo *ve;
  VarInfo *v;
  FuncScope *bl_local;
  LexState *ls_local;
  
  ve = ls->vstack + bl->vstart;
  pVVar2 = ls->vstack;
  uVar1 = ls->vtop;
  do {
    if (pVVar2 + uVar1 <= ve) {
      return;
    }
    uVar3 = (ve->name).gcptr64;
    if (uVar3 != 0) {
      if ((ve->info & 4) == 0) {
        if ((ve->info & 2) != 0) {
          if (bl->prev == (FuncScope *)0x0) {
            ls->linenumber = ls->fs->bcbase[ve->startpc].line;
            if (uVar3 != 1) {
              lj_lex_error(ls,0,LJ_ERR_XLUNDEF,uVar3 + 0x18);
            }
            lj_lex_error(ls,0,LJ_ERR_XBREAK);
          }
          bVar6 = 4;
          if (uVar3 == 1) {
            bVar6 = 2;
          }
          bl->prev->flags = bl->prev->flags | bVar6;
          ve->slot = bl->nactvar;
          if ((bl->flags & 8) != 0) {
            gola_close(ls,ve);
          }
        }
      }
      else {
        (ve->name).gcptr64 = 0;
        pVVar5 = ve;
        while (pVVar4 = pVVar5, local_38 = pVVar4 + 1, local_38 < pVVar2 + uVar1) {
          pVVar5 = local_38;
          if (((local_38->name).gcptr64 == uVar3) && (pVVar5 = local_38, (pVVar4[1].info & 2) != 0))
          {
            if (((bl->flags & 8) != 0) && (ve->slot < pVVar4[1].slot)) {
              gola_close(ls,local_38);
            }
            gola_patch(ls,local_38,ve);
            pVVar5 = local_38;
          }
        }
      }
    }
    ve = ve + 1;
  } while( true );
}

Assistant:

static void gola_fixup(LexState *ls, FuncScope *bl)
{
  VarInfo *v = ls->vstack + bl->vstart;
  VarInfo *ve = ls->vstack + ls->vtop;
  for (; v < ve; v++) {
    GCstr *name = strref(v->name);
    if (name != NULL) {  /* Only consider remaining valid gotos/labels. */
      if (gola_islabel(v)) {
	VarInfo *vg;
	setgcrefnull(v->name);  /* Invalidate label that goes out of scope. */
	for (vg = v+1; vg < ve; vg++)  /* Resolve pending backward gotos. */
	  if (strref(vg->name) == name && gola_isgoto(vg)) {
	    if ((bl->flags&FSCOPE_UPVAL) && vg->slot > v->slot)
	      gola_close(ls, vg);
	    gola_patch(ls, vg, v);
	  }
      } else if (gola_isgoto(v)) {
	if (bl->prev) {  /* Propagate goto or break to outer scope. */
	  bl->prev->flags |= name == NAME_BREAK ? FSCOPE_BREAK : FSCOPE_GOLA;
	  v->slot = bl->nactvar;
	  if ((bl->flags & FSCOPE_UPVAL))
	    gola_close(ls, v);
	} else {  /* No outer scope: undefined goto label or no loop. */
	  ls->linenumber = ls->fs->bcbase[v->startpc].line;
	  if (name == NAME_BREAK)
	    lj_lex_error(ls, 0, LJ_ERR_XBREAK);
	  else
	    lj_lex_error(ls, 0, LJ_ERR_XLUNDEF, strdata(name));
	}
      }
    }
  }
}